

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

BlockAddressed * __thiscall
Network::RecvBlock(BlockAddressed *__return_storage_ptr__,Network *this,network_address_t dst)

{
  bool bVar1;
  pointer pBVar2;
  reference pBVar3;
  runtime_error *this_00;
  const_iterator local_58 [3];
  undefined1 local_39;
  _Self local_38;
  _Self local_30;
  iterator it;
  lock_guard<std::mutex> guard;
  network_address_t dst_local;
  Network *this_local;
  BlockAddressed *bk;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&it,&this->_mutex);
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<BlockAddressed,_std::allocator<BlockAddressed>_>::begin(&this->_blocks);
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<BlockAddressed,_std::allocator<BlockAddressed>_>::end(&this->_blocks);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"no block for you");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pBVar2 = std::_List_iterator<BlockAddressed>::operator->(&local_30);
    if (pBVar2->dst == dst) break;
    std::_List_iterator<BlockAddressed>::operator++(&local_30);
  }
  local_39 = 0;
  pBVar3 = std::_List_iterator<BlockAddressed>::operator*(&local_30);
  BlockAddressed::BlockAddressed(__return_storage_ptr__,pBVar3);
  std::_List_const_iterator<BlockAddressed>::_List_const_iterator(local_58,&local_30);
  std::__cxx11::list<BlockAddressed,_std::allocator<BlockAddressed>_>::erase
            (&this->_blocks,local_58[0]);
  local_39 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it);
  return __return_storage_ptr__;
}

Assistant:

BlockAddressed Network::RecvBlock(network_address_t dst) {
  std::lock_guard<std::mutex> guard(_mutex);
  for (auto it = _blocks.begin(); it !=_blocks.end(); ++it)
  {
    if(it->dst == dst)
    {
      auto bk = *it;
      _blocks.erase(it);
      return bk;
    }
  }
  throw std::runtime_error("no block for you");
}